

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt_test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  bool bVar1;
  char **v;
  bool bVar2;
  LogLevel LVar3;
  int iVar4;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  UnitTest *this;
  undefined8 extraout_RAX;
  long lVar5;
  pointer unaff_R12;
  undefined7 uVar6;
  void *pvVar7;
  bool listTests;
  int googleArgc;
  char *googleArgv [4];
  string testFilter;
  string logLevel;
  string filter;
  PBRTOptions opt;
  bool local_2cd;
  int local_2cc;
  char **local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c0;
  string local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_290;
  string local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  _Any_data local_1e8;
  code *local_1d8;
  code *local_1d0;
  _Any_data local_1c8;
  code *local_1b8;
  code *local_1b0;
  _Any_data local_1a8;
  code *local_198;
  code *local_190;
  _Any_data local_188;
  code *local_178;
  code *local_170;
  char *local_168;
  undefined8 local_160;
  char local_158;
  undefined7 uStack_157;
  string local_148;
  PBRTOptions local_128;
  
  local_128.imageFile._M_dataplus._M_p = (pointer)&local_128.imageFile.field_2;
  local_128.super_BasicOptions.nThreads = 0;
  local_128.super_BasicOptions.seed = 0;
  local_128.super_BasicOptions.renderingSpace = CameraWorld;
  local_128.logLevel = Error;
  local_128.pixelSamples.set = false;
  local_128.gpuDevice.set = false;
  local_128.imageFile._M_string_length = 0;
  local_128.imageFile.field_2._M_local_buf[0] = '\0';
  local_128.mseReferenceImage._M_dataplus._M_p = (pointer)&local_128.mseReferenceImage.field_2;
  local_128.mseReferenceImage._M_string_length = 0;
  local_128.mseReferenceImage.field_2._M_local_buf[0] = '\0';
  local_128.mseReferenceOutput._M_dataplus._M_p = (pointer)&local_128.mseReferenceOutput.field_2;
  local_128.mseReferenceOutput._M_string_length = 0;
  local_128.mseReferenceOutput.field_2._M_local_buf[0] = '\0';
  local_128.debugStart._M_dataplus._M_p = (pointer)&local_128.debugStart.field_2;
  local_128.debugStart._M_string_length = 0;
  local_128.debugStart.field_2._M_local_buf[0] = '\0';
  local_128.displayServer._M_dataplus._M_p = (pointer)&local_128.displayServer.field_2;
  local_128.displayServer._M_string_length = 0;
  local_128.displayServer.field_2._M_local_buf[0] = '\0';
  local_128.cropWindow.set = false;
  local_128.pixelBounds.set = false;
  local_128.super_BasicOptions.quickRender = false;
  local_128.super_BasicOptions.quiet = true;
  local_128.super_BasicOptions.recordPixelStatistics = false;
  local_128.super_BasicOptions.upgrade = false;
  local_128.super_BasicOptions.disablePixelJitter = false;
  local_128.super_BasicOptions.disableWavelengthJitter = false;
  local_128.super_BasicOptions.forceDiffuse = false;
  local_128.super_BasicOptions.useGPU = false;
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_2c8 = argv;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"error","");
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = '\0';
  local_2cd = false;
  local_2c8 = local_2c8 + 1;
  local_2c0 = &local_288.field_2;
  local_290 = &local_268.field_2;
  do {
    if (*local_2c8 == (char *)0x0) {
      LVar3 = pbrt::LogLevelFromString(&local_228);
      local_128.logLevel = LVar3;
      pbrt::InitPBRT(&local_128);
      local_2cc = 1;
      local_2b8._M_string_length = 0;
      local_2b8.field_2._M_allocated_capacity = 0;
      local_2b8.field_2._8_8_ = 0;
      local_2b8._M_dataplus._M_p = *local_2c8;
      local_160 = 0;
      local_158 = '\0';
      local_168 = &local_158;
      if (local_248._M_string_length != 0) {
        local_148._M_string_length = 0;
        local_148.field_2._M_local_buf[0] = '\0';
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        pbrt::detail::stringPrintfRecursive<std::__cxx11::string&>
                  (&local_148,"--gtest_filter=%s",&local_248);
        std::__cxx11::string::operator=((string *)&local_168,(string *)&local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,
                          CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                   local_148.field_2._M_local_buf[0]) + 1);
        }
        lVar5 = (long)local_2cc;
        local_2cc = local_2cc + 1;
        (&local_2b8._M_dataplus)[lVar5]._M_p = local_168;
      }
      if (local_2cd == true) {
        lVar5 = (long)local_2cc;
        local_2cc = local_2cc + 1;
        (&local_2b8._M_dataplus)[lVar5]._M_p = "--gtest_list_tests";
      }
      testing::InitGoogleTest(&local_2cc,(char **)&local_2b8);
      this = testing::UnitTest::GetInstance();
      iVar4 = testing::UnitTest::Run(this);
      pbrt::CleanupPBRT();
      if (local_168 != &local_158) {
        operator_delete(local_168,CONCAT71(uStack_157,local_158) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                 local_248.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if (local_128.pixelBounds.set == true) {
        local_128.pixelBounds.set = false;
      }
      if (local_128.cropWindow.set == true) {
        local_128.cropWindow.set = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.displayServer._M_dataplus._M_p != &local_128.displayServer.field_2) {
        operator_delete(local_128.displayServer._M_dataplus._M_p,
                        CONCAT71(local_128.displayServer.field_2._M_allocated_capacity._1_7_,
                                 local_128.displayServer.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.debugStart._M_dataplus._M_p != &local_128.debugStart.field_2) {
        operator_delete(local_128.debugStart._M_dataplus._M_p,
                        CONCAT71(local_128.debugStart.field_2._M_allocated_capacity._1_7_,
                                 local_128.debugStart.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.mseReferenceOutput._M_dataplus._M_p != &local_128.mseReferenceOutput.field_2)
      {
        operator_delete(local_128.mseReferenceOutput._M_dataplus._M_p,
                        CONCAT71(local_128.mseReferenceOutput.field_2._M_allocated_capacity._1_7_,
                                 local_128.mseReferenceOutput.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.mseReferenceImage._M_dataplus._M_p != &local_128.mseReferenceImage.field_2) {
        operator_delete(local_128.mseReferenceImage._M_dataplus._M_p,
                        CONCAT71(local_128.mseReferenceImage.field_2._M_allocated_capacity._1_7_,
                                 local_128.mseReferenceImage.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.imageFile._M_dataplus._M_p != &local_128.imageFile.field_2) {
        operator_delete(local_128.imageFile._M_dataplus._M_p,
                        CONCAT71(local_128.imageFile.field_2._M_allocated_capacity._1_7_,
                                 local_128.imageFile.field_2._M_local_buf[0]) + 1);
      }
      return iVar4;
    }
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"list-tests","");
    local_188._M_unused._M_object = (void *)0x0;
    local_188._8_8_ = 0;
    local_170 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                ::_M_invoke;
    local_178 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                ::_M_manager;
    bVar2 = pbrt::ParseArg<bool*>
                      (&local_2c8,&local_2b8,&local_2cd,
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)&local_188);
    pvVar7 = (void *)(CONCAT71(extraout_var,bVar2) & 0xffffffff);
    uVar6 = (undefined7)((ulong)unaff_R12 >> 8);
    unaff_R12 = (pointer)CONCAT71(uVar6,1);
    if (bVar2) {
LAB_002652f5:
      bVar1 = false;
      bVar2 = false;
    }
    else {
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"log-level","");
      local_1a8._M_unused._M_object = (void *)0x0;
      local_1a8._8_8_ = 0;
      local_190 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                  ::_M_invoke;
      local_198 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                  ::_M_manager;
      bVar2 = pbrt::ParseArg<std::__cxx11::string*>
                        (&local_2c8,&local_288,&local_228,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)&local_1a8);
      if (bVar2) goto LAB_002652f5;
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"nthreads","");
      local_1c8._M_unused._M_object = (void *)0x0;
      local_1c8._8_8_ = 0;
      local_1b0 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                  ::_M_invoke;
      local_1b8 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                  ::_M_manager;
      bVar2 = pbrt::ParseArg<int*>
                        (&local_2c8,&local_268,(int *)&local_128,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)&local_1c8);
      if (bVar2) {
        bVar1 = true;
        bVar2 = false;
        unaff_R12 = (pointer)CONCAT71(uVar6,1);
      }
      else {
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"test-filter","");
        local_1e8._M_unused._M_object = (void *)0x0;
        local_1e8._8_8_ = 0;
        local_1d0 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                    ::_M_invoke;
        local_1d8 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                    ::_M_manager;
        bVar2 = pbrt::ParseArg<std::__cxx11::string*>
                          (&local_2c8,&local_208,&local_248,
                           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                            *)&local_1e8);
        unaff_R12 = (pointer)(CONCAT71(extraout_var_00,bVar2) & 0xffffffff);
        bVar1 = true;
        bVar2 = true;
      }
    }
    if (bVar2) {
      if (local_1d8 != (code *)0x0) {
        (*local_1d8)(&local_1e8,&local_1e8,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar1) {
      if (local_1b8 != (code *)0x0) {
        (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
    }
    if ((char)pvVar7 == '\0') {
      if (local_198 != (code *)0x0) {
        (*local_198)(&local_1a8,&local_1a8,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_178 != (code *)0x0) {
      (*local_178)(&local_188,&local_188,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    v = local_2c8;
    if ((char)unaff_R12 == '\0') {
      __s1 = *local_2c8;
      iVar4 = strcmp(__s1,"--help");
      if ((iVar4 == 0) || (iVar4 = strcmp(__s1,"-h"), iVar4 == 0)) {
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"");
      }
      else {
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        local_2b8._M_string_length = 0;
        local_2b8.field_2._M_allocated_capacity =
             local_2b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        pbrt::detail::stringPrintfRecursive<char*&>(&local_2b8,"argument \"%s\" unknown",v);
      }
      usage(&local_2b8);
      if (local_148._M_dataplus._M_p != unaff_R12) {
        operator_delete(local_148._M_dataplus._M_p,
                        CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                 local_148.field_2._M_local_buf[0]) + 1);
      }
      if (local_168 != (char *)pvVar7) {
        operator_delete(local_168,CONCAT71(uStack_157,local_158) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                 local_248.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      pbrt::PBRTOptions::~PBRTOptions(&local_128);
      _Unwind_Resume(extraout_RAX);
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
    PBRTOptions opt;
    opt.quiet = true;
    std::string logLevel = "error";
    std::string testFilter;
    bool listTests = false;

    char **origArgv = argv;
    // Process command-line arguments
    ++argv;
    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage(err);
            exit(1);
        };

        if (ParseArg(&argv, "list-tests", &listTests, onError) ||
            ParseArg(&argv, "log-level", &logLevel, onError) ||
            ParseArg(&argv, "nthreads", &opt.nThreads, onError) ||
            ParseArg(&argv, "test-filter", &testFilter, onError)) {
            // success
        } else if ((strcmp(*argv, "--help") == 0) || (strcmp(*argv, "-h") == 0)) {
            usage();
            return 0;
        } else {
            usage(StringPrintf("argument \"%s\" unknown", *argv));
            return 1;
        }
    }

    opt.logLevel = LogLevelFromString(logLevel);

    InitPBRT(opt);

    int googleArgc = 1;
    const char *googleArgv[4] = {};
    googleArgv[0] = argv[0];
    std::string filter;
    if (!testFilter.empty()) {
        filter = StringPrintf("--gtest_filter=%s", testFilter);
        googleArgv[googleArgc++] = filter.c_str();
    }
    if (listTests)
        googleArgv[googleArgc++] = "--gtest_list_tests";

    testing::InitGoogleTest(&googleArgc, (char **)googleArgv);

    int ret = RUN_ALL_TESTS();

    CleanupPBRT();

    return ret;
}